

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall wabt::MemoryStream::MemoryStream(MemoryStream *this,Stream *log_stream)

{
  OutputBuffer *this_00;
  Stream *log_stream_local;
  MemoryStream *this_local;
  
  Stream::Stream(&this->super_Stream,log_stream);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__MemoryStream_004ae4e8;
  this_00 = (OutputBuffer *)operator_new(0x18);
  memset(this_00,0,0x18);
  OutputBuffer::OutputBuffer(this_00);
  std::unique_ptr<wabt::OutputBuffer,std::default_delete<wabt::OutputBuffer>>::
  unique_ptr<std::default_delete<wabt::OutputBuffer>,void>
            ((unique_ptr<wabt::OutputBuffer,std::default_delete<wabt::OutputBuffer>> *)&this->buf_,
             this_00);
  return;
}

Assistant:

MemoryStream::MemoryStream(Stream* log_stream)
    : Stream(log_stream), buf_(new OutputBuffer()) {}